

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<char_const>::operator==
          (ArrayPtr<char_const> *this,ArrayPtr<const_unsigned_char> *other)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  byte *pbVar4;
  ulong local_28;
  size_t i;
  ArrayPtr<const_unsigned_char> *other_local;
  ArrayPtr<const_char> *this_local;
  
  sVar2 = *(size_t *)(this + 8);
  sVar3 = ArrayPtr<const_unsigned_char>::size(other);
  if (sVar2 == sVar3) {
    for (local_28 = 0; local_28 < *(ulong *)(this + 8); local_28 = local_28 + 1) {
      cVar1 = *(char *)(*(long *)this + local_28);
      pbVar4 = ArrayPtr<const_unsigned_char>::operator[](other,local_28);
      if ((int)cVar1 != (uint)*pbVar4) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr<U>& other) const {
    if (size_ != other.size()) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }